

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O1

callback_t *
begin_property_state
          (callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  QTextStream *pQVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  int iVar4;
  QDebug *pQVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  initializer_list<char> __l;
  string property_name;
  undefined2 local_90;
  undefined6 uStack_8e;
  QString local_88;
  allocator_type local_69;
  string local_68;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  clear_empty(f);
  anon_unknown.dwarf_22738::trim((string *)&(anonymous_namespace)::global_string_abi_cxx11_);
  local_68._M_dataplus._M_p._0_4_ = 0;
  local_68._M_dataplus._M_p._4_4_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MetaProperty,std::allocator<MetaProperty>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length,
             (MetaProperty **)&local_68,(allocator<MetaProperty> *)&local_88);
  (anonymous_namespace)::current_property =
       (undefined8 *)CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_);
  uVar3 = CONCAT44(local_68._M_string_length._4_4_,(undefined4)local_68._M_string_length);
  local_68._M_dataplus._M_p._0_4_ = 0;
  local_68._M_dataplus._M_p._4_4_ = 0;
  local_68._M_string_length._0_4_ = 0;
  local_68._M_string_length._4_4_ = 0;
  if (DAT_001192f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(DAT_001192f0);
    DAT_001192f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    uVar3 = DAT_001192f0;
  }
  DAT_001192f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_68._M_string_length._4_4_,(undefined4)local_68._M_string_length) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_68._M_string_length._4_4_,(undefined4)local_68._M_string_length));
  }
  iVar4 = std::__cxx11::string::compare((char *)&(anonymous_namespace)::global_string_abi_cxx11_);
  if (iVar4 == 0) {
    *(undefined1 *)((anonymous_namespace)::current_property + 0x14) = 1;
    std::operator>>((istream *)f,(string *)&(anonymous_namespace)::global_string_abi_cxx11_);
    parser();
    if ((parser()::category[0x10] & 1) != 0) {
      parser();
      local_68._M_dataplus._M_p._0_4_ = 2;
      local_68._M_dataplus._M_p._4_4_ = 0;
      local_68._M_string_length._0_4_ = 0;
      local_68._M_string_length._4_4_ = 0;
      local_68.field_2._M_allocated_capacity._0_4_ = 0;
      local_68.field_2._M_allocated_capacity._4_4_ = 0;
      local_68.field_2._8_8_ = parser()::category._8_8_;
      QMessageLogger::debug();
      pQVar1 = (QTextStream *)CONCAT62(uStack_8e,local_90);
      QVar6.m_data = (storage_type *)0xe;
      QVar6.m_size = (qsizetype)&local_88;
      QString::fromUtf8(QVar6);
      QTextStream::operator<<(pQVar1,&local_88);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
        }
      }
      if (((QTextStream *)CONCAT62(uStack_8e,local_90))[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)CONCAT62(uStack_8e,local_90),' ');
      }
      operator<<((QDebug *)&local_90,(string *)&(anonymous_namespace)::global_string_abi_cxx11_);
      QDebug::~QDebug((QDebug *)&local_90);
    }
  }
  std::__cxx11::string::_M_assign((string *)((anonymous_namespace)::current_property + 10));
  puVar2 = (anonymous_namespace)::current_property;
  *(anonymous_namespace)::current_property = (anonymous_namespace)::current_class;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar2 + 1),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DAT_00119300);
  DAT_00119310 = 0;
  *(anonymous_namespace)::global_string_abi_cxx11_ = 0;
  local_90 = 0xa3d;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_90;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_88,__l,&local_69);
  read_untill_delimiters_abi_cxx11_(&local_68,f,(vector<char,_std::allocator<char>_> *)&local_88);
  std::__cxx11::string::operator=((string *)&local_40,(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_) !=
      &local_68.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_),
                    CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                             local_68.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    operator_delete(local_88.d.d,local_88.d.size - (long)local_88.d.d);
  }
  anon_unknown.dwarf_22738::trim(&local_40);
  std::__cxx11::string::_M_assign((string *)((anonymous_namespace)::current_property + 2));
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_68._M_dataplus._M_p._0_4_ = 2;
    local_68._M_dataplus._M_p._4_4_ = 0;
    local_68._M_string_length._0_4_ = 0;
    local_68._M_string_length._4_4_ = 0;
    local_68.field_2._M_allocated_capacity._0_4_ = 0;
    local_68.field_2._M_allocated_capacity._4_4_ = 0;
    local_68.field_2._8_8_ = parser()::category._8_8_;
    QMessageLogger::debug();
    pQVar1 = (QTextStream *)CONCAT62(uStack_8e,local_90);
    QVar7.m_data = (storage_type *)0x12;
    QVar7.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(pQVar1,&local_88);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    if (((QTextStream *)CONCAT62(uStack_8e,local_90))[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)CONCAT62(uStack_8e,local_90),' ');
    }
    pQVar5 = operator<<((QDebug *)&local_90,&local_40);
    pQVar1 = *(QTextStream **)pQVar5;
    QVar8.m_data = (storage_type *)0x1;
    QVar8.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<(pQVar1,&local_88);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    if ((*(QTextStream **)pQVar5)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)pQVar5,' ');
    }
    QDebug::~QDebug((QDebug *)&local_90);
  }
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = property_state;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

callback_t begin_property_state(MetaConfiguration &conf, std::ifstream &f,
                                int &error) {
  // here we know that we have at least the type of the property,
  // but it can be three kinds of string.

  std::string property_name;
  clear_empty(f);

  trim(global_string);
  current_property = std::make_shared<MetaProperty>();

  if (global_string == "enum") {
    current_property->is_enum = true;
    f >> global_string;
    qCDebug(parser) << "Enum with type" << global_string;
  }

  current_property->type = global_string;
  current_property->parent = current_class;
  global_string.clear();

  // find the name of the property
  property_name = read_untill_delimiters(f, {'=', '\n'});
  trim(property_name);
  current_property->name = property_name;
  qCDebug(parser) << "Starting property " << property_name << " ";
  return property_state;
}